

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O3

djpeg_dest_ptr jinit_write_bmp(j_decompress_ptr cinfo,boolean is_os2,boolean use_inversion_array)

{
  int *piVar1;
  J_COLOR_SPACE JVar2;
  uint uVar3;
  jpeg_error_mgr *pjVar4;
  JDIMENSION JVar5;
  uint uVar6;
  cd_progress_ptr progress;
  djpeg_dest_ptr pdVar7;
  code *pcVar8;
  jvirt_sarray_ptr pjVar9;
  JSAMPARRAY ppJVar10;
  JDIMENSION JVar11;
  
  pdVar7 = (djpeg_dest_ptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x68);
  pdVar7->start_output = start_output_bmp;
  pdVar7->finish_output = finish_output_bmp;
  pdVar7->calc_buffer_dimensions = (_func_void_j_decompress_ptr_djpeg_dest_ptr *)0x0;
  *(boolean *)&pdVar7[1].start_output = is_os2;
  JVar2 = cinfo->out_color_space;
  if (JVar2 == JCS_RGB) {
LAB_00105624:
    if (cinfo->quantize_colors != 0) goto LAB_0010562a;
LAB_00105654:
    pcVar8 = put_pixel_rows;
  }
  else {
    if (JVar2 != JCS_GRAYSCALE) {
      if (JVar2 - JCS_EXT_RGB < 10) goto LAB_00105624;
      if ((cinfo->quantize_colors != 0) || ((JVar2 != JCS_RGB565 && (JVar2 != JCS_CMYK)))) {
        pjVar4 = cinfo->err;
        pjVar4->msg_code = 0x3ed;
        (*pjVar4->error_exit)((j_common_ptr)cinfo);
        goto LAB_0010565f;
      }
      goto LAB_00105654;
    }
LAB_0010562a:
    pcVar8 = put_gray_rows;
  }
  pdVar7->put_pixel_rows = pcVar8;
LAB_0010565f:
  jpeg_calc_output_dimensions(cinfo);
  JVar2 = cinfo->out_color_space;
  if (JVar2 == JCS_RGB565) {
    uVar3 = cinfo->output_width;
    uVar6 = uVar3 * 3;
    *(uint *)&pdVar7[1].finish_output = uVar6;
    *(uint *)((long)&pdVar7[1].finish_output + 4) = uVar6;
    JVar5 = ((uVar3 & 1) + uVar3) * 2;
  }
  else if ((cinfo->quantize_colors == 0) &&
          ((JVar2 == JCS_RGB || (JVar2 == JCS_CMYK || JVar2 - JCS_EXT_RGB < 10)))) {
    JVar5 = cinfo->output_components * cinfo->output_width;
    uVar6 = cinfo->output_width * 3;
    *(uint *)&pdVar7[1].finish_output = uVar6;
    *(uint *)((long)&pdVar7[1].finish_output + 4) = uVar6;
  }
  else {
    JVar5 = cinfo->output_components * cinfo->output_width;
    *(JDIMENSION *)&pdVar7[1].finish_output = JVar5;
    *(JDIMENSION *)((long)&pdVar7[1].finish_output + 4) = JVar5;
    uVar6 = JVar5;
  }
  JVar11 = uVar6;
  if ((uVar6 & 3) != 0) {
    JVar11 = (uVar6 | 3) + 1;
    *(JDIMENSION *)((long)&pdVar7[1].finish_output + 4) = JVar11;
  }
  *(JDIMENSION *)&pdVar7[1].calc_buffer_dimensions = JVar11 - uVar6;
  if (use_inversion_array == 0) {
    ppJVar10 = (JSAMPARRAY)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(size_t)JVar11);
    pdVar7[1].buffer = ppJVar10;
  }
  else {
    pjVar9 = (*cinfo->mem->request_virt_sarray)
                       ((j_common_ptr)cinfo,1,0,JVar11,cinfo->output_height,1);
    pdVar7[1].put_pixel_rows = (_func_void_j_decompress_ptr_djpeg_dest_ptr_JDIMENSION *)pjVar9;
    *(undefined4 *)((long)&pdVar7[1].calc_buffer_dimensions + 4) = 0;
    if (cinfo->progress != (jpeg_progress_mgr *)0x0) {
      piVar1 = (int *)((long)&cinfo->progress[1].progress_monitor + 4);
      *piVar1 = *piVar1 + 1;
    }
  }
  *(boolean *)&pdVar7[1].output_file = use_inversion_array;
  ppJVar10 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,JVar5,1);
  pdVar7->buffer = ppJVar10;
  pdVar7->buffer_height = 1;
  return pdVar7;
}

Assistant:

GLOBAL(djpeg_dest_ptr)
jinit_write_bmp(j_decompress_ptr cinfo, boolean is_os2,
                boolean use_inversion_array)
{
  bmp_dest_ptr dest;
  JDIMENSION row_width;

  /* Create module interface object, fill in method pointers */
  dest = (bmp_dest_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(bmp_dest_struct));
  dest->pub.start_output = start_output_bmp;
  dest->pub.finish_output = finish_output_bmp;
  dest->pub.calc_buffer_dimensions = NULL;
  dest->is_os2 = is_os2;

  if (cinfo->out_color_space == JCS_GRAYSCALE) {
    dest->pub.put_pixel_rows = put_gray_rows;
  } else if (IsExtRGB(cinfo->out_color_space)) {
    if (cinfo->quantize_colors)
      dest->pub.put_pixel_rows = put_gray_rows;
    else
      dest->pub.put_pixel_rows = put_pixel_rows;
  } else if (!cinfo->quantize_colors &&
             (cinfo->out_color_space == JCS_RGB565 ||
              cinfo->out_color_space == JCS_CMYK)) {
    dest->pub.put_pixel_rows = put_pixel_rows;
  } else {
    ERREXIT(cinfo, JERR_BMP_COLORSPACE);
  }

  /* Calculate output image dimensions so we can allocate space */
  jpeg_calc_output_dimensions(cinfo);

  /* Determine width of rows in the BMP file (padded to 4-byte boundary). */
  if (cinfo->out_color_space == JCS_RGB565) {
    row_width = cinfo->output_width * 2;
    dest->row_width = dest->data_width = cinfo->output_width * 3;
    while ((row_width & 3) != 0) row_width++;
  } else if (!cinfo->quantize_colors &&
             (IsExtRGB(cinfo->out_color_space) ||
              cinfo->out_color_space == JCS_CMYK)) {
    row_width = cinfo->output_width * cinfo->output_components;
    dest->row_width = dest->data_width = cinfo->output_width * 3;
  } else {
    row_width = cinfo->output_width * cinfo->output_components;
    dest->row_width = dest->data_width = row_width;
  }
  while ((dest->row_width & 3) != 0) dest->row_width++;
  dest->pad_bytes = (int)(dest->row_width - dest->data_width);


  if (use_inversion_array) {
    /* Allocate space for inversion array, prepare for write pass */
    dest->whole_image = (*cinfo->mem->request_virt_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, FALSE,
       dest->row_width, cinfo->output_height, (JDIMENSION)1);
    dest->cur_output_row = 0;
    if (cinfo->progress != NULL) {
      cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;
      progress->total_extra_passes++; /* count file input as separate pass */
    }
  } else {
    dest->iobuffer = (JSAMPLE *)(*cinfo->mem->alloc_small)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, dest->row_width);
  }
  dest->use_inversion_array = use_inversion_array;

  /* Create decompressor output buffer. */
  dest->pub.buffer = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, row_width, (JDIMENSION)1);
  dest->pub.buffer_height = 1;

  return (djpeg_dest_ptr)dest;
}